

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int plan2d(PlannerType plannerType,char *envCfgFilename,bool forwardSearch)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  anaPlanner *this;
  ostream *poVar4;
  FILE *__stream;
  runtime_error *prVar5;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  MDPConfig MDPCfg;
  EnvironmentNAV2D environment_nav2D;
  void *local_298;
  void *pvStack_290;
  long local_288;
  undefined4 local_278;
  undefined4 local_274;
  _IO_FILE local_270 [2];
  
  EnvironmentNAV2D::EnvironmentNAV2D((EnvironmentNAV2D *)local_270);
  cVar2 = EnvironmentNAV2D::InitializeEnv((char *)local_270);
  if (cVar2 == '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"ERROR: InitializeEnv failed");
  }
  else {
    cVar2 = EnvironmentNAV2D::InitializeMDPCfg((MDPConfig *)local_270);
    if (cVar2 != '\0') {
      local_298 = (void *)0x0;
      pvStack_290 = (void *)0x0;
      local_288 = 0;
      switch(plannerType) {
      case PLANNER_TYPE_ADSTAR:
        puts("Initializing ADPlanner...");
        this = (anaPlanner *)operator_new(0x98);
        ADPlanner::ADPlanner((ADPlanner *)this,(DiscreteSpaceInformation *)local_270,forwardSearch);
        break;
      case PLANNER_TYPE_ARASTAR:
        puts("Initializing ARAPlanner...");
        this = (anaPlanner *)operator_new(0xa0);
        ARAPlanner::ARAPlanner
                  ((ARAPlanner *)this,(DiscreteSpaceInformation *)local_270,forwardSearch);
        break;
      default:
        puts("Invalid planner type");
        this = (anaPlanner *)0x0;
        break;
      case PLANNER_TYPE_RSTAR:
        puts("Initializing RSTARPlanner...");
        this = (anaPlanner *)operator_new(0x68);
        RSTARPlanner::RSTARPlanner
                  ((RSTARPlanner *)this,(DiscreteSpaceInformation *)local_270,forwardSearch);
        break;
      case PLANNER_TYPE_ANASTAR:
        puts("Initializing anaPlanner...");
        this = (anaPlanner *)operator_new(0x48);
        anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)local_270,forwardSearch);
      }
      (**(code **)(*(long *)this + 0x40))(this,0);
      iVar3 = (**(code **)(*(long *)this + 0x28))(this,local_278);
      if (iVar3 == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"ERROR: failed to set start state");
      }
      else {
        iVar3 = (**(code **)(*(long *)this + 0x20))(this,local_274);
        if (iVar3 != 0) {
          (**(code **)(*(long *)this + 0x90))(0,this);
          puts("start planning...");
          iVar3 = (*(code *)**(undefined8 **)this)(0,this,&local_298);
          puts("done planning");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"size of solution=",0x11);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          EnvironmentNAV2D::PrintTimeStat(local_270);
          __stream = fopen("sol.txt","w");
          if (__stream != (FILE *)0x0) {
            if (pvStack_290 != local_298) {
              uVar6 = 0;
              uVar7 = 1;
              do {
                EnvironmentNAV2D::PrintState
                          ((int)local_270,SUB41(*(undefined4 *)((long)local_298 + uVar6 * 4),0),
                           (_IO_FILE *)0x0);
                bVar1 = uVar7 < (ulong)((long)pvStack_290 - (long)local_298 >> 2);
                uVar6 = uVar7;
                uVar7 = (ulong)((int)uVar7 + 1);
              } while (bVar1);
            }
            fclose(__stream);
            EnvironmentNAV2D::PrintTimeStat(local_270);
            __s = "Solution is found";
            if (iVar3 == 0) {
              __s = "Solution does not exist";
            }
            puts(__s);
            fflush((FILE *)0x0);
            (**(code **)(*(long *)this + 0xa0))(this);
            if (local_298 != (void *)0x0) {
              operator_delete(local_298,local_288 - (long)local_298);
            }
            EnvironmentNAV2D::~EnvironmentNAV2D((EnvironmentNAV2D *)local_270);
            return iVar3;
          }
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"ERROR: could not open solution file");
          *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
          __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"ERROR: failed to set goal state");
      }
      *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
      __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"ERROR: InitializeMDPCfg failed");
  }
  *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int plan2d(PlannerType plannerType, char* envCfgFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 100.0; // in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    // Initialize Environment (should be called before initializing anything else)
    EnvironmentNAV2D environment_nav2D;
    if (!environment_nav2D.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // Initialize MDP Info
    if (!environment_nav2D.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_nav2D, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_nav2D, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set search mode
    planner->set_search_mode(bsearchuntilfirstsolution);

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    planner->set_initialsolution_eps(initialEpsilon);

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    environment_nav2D.PrintTimeStat(stdout);

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    for (unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
        environment_nav2D.PrintState(solution_stateIDs_V[i], false, fSol);
    }
    fclose(fSol);

    environment_nav2D.PrintTimeStat(stdout);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}